

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  char **ppcVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  string range;
  char *hg_log [8];
  OutputLogger err;
  LogParser out;
  long *local_288;
  long local_278;
  long lStack_270;
  pointer local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  long *local_248;
  char *local_240;
  char *local_238;
  undefined8 local_230;
  OutputLogger local_220;
  LogParser local_1e0;
  
  ppcVar1 = &local_1e0.super_OutputLogger.super_LineParser.Prefix;
  pcVar2 = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  local_1e0.super_OutputLogger.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
  std::__cxx11::string::append((char *)&local_1e0);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1e0,
                              (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_278 = *plVar4;
    lStack_270 = plVar3[3];
    local_288 = &local_278;
  }
  else {
    local_278 = *plVar4;
    local_288 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_1e0.super_OutputLogger.super_LineParser.super_OutputParser._vptr_OutputParser !=
      (_func_int **)ppcVar1) {
    operator_delete(local_1e0.super_OutputLogger.super_LineParser.super_OutputParser.
                    _vptr_OutputParser,
                    (ulong)(local_1e0.super_OutputLogger.super_LineParser.Prefix + 1));
  }
  local_268 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_260 = "log";
  local_258 = "--removed";
  local_250 = "-r";
  local_248 = local_288;
  local_240 = "--template";
  local_238 = 
  "<logentry\n   revision=\"{node|short}\">\n  <author>{author|person}</author>\n  <email>{author|email}</email>\n  <date>{date|isodate}</date>\n  <msg>{desc}</msg>\n  <files>{files}</files>\n  <file_adds>{file_adds}</file_adds>\n  <file_dels>{file_dels}</file_dels>\n</logentry>\n"
  ;
  local_230 = 0;
  LogParser::LogParser(&local_1e0,this,"log-out> ");
  (*local_1e0.super_OutputLogger.super_LineParser.super_OutputParser._vptr_OutputParser[2])
            (&local_1e0,"<?xml version=\"1.0\"?>\n<log>\n",0x1c);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_220,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_268,(OutputParser *)&local_1e0,
                      (OutputParser *)&local_220,(char *)0x0,Auto);
  (*local_1e0.super_OutputLogger.super_LineParser.super_OutputParser._vptr_OutputParser[2])
            (&local_1e0,"</log>\n",7);
  local_220.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00963908;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.super_LineParser.Line._M_dataplus._M_p !=
      &local_220.super_LineParser.Line.field_2) {
    operator_delete(local_220.super_LineParser.Line._M_dataplus._M_p,
                    local_220.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  LogParser::~LogParser(&local_1e0);
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  const char* hg = this->CommandLineTool.c_str();
  const char* hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  const char* hg_log[] = {
    hg,           "log",         "--removed", "-r", range.c_str(),
    "--template", hgXMLTemplate, nullptr
  };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}